

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::scrollContentsBy(QTextEdit *this,int dx,int dy)

{
  long lVar1;
  undefined8 uVar2;
  LayoutDirection LVar3;
  int dx_00;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  LVar3 = QWidget::layoutDirection((QWidget *)this);
  dx_00 = -dx;
  if (LVar3 != RightToLeft) {
    dx_00 = dx;
  }
  QWidget::scroll(*(QWidget **)(lVar1 + 0x2b0),dx_00,dy);
  uVar2 = QGuiApplication::inputMethod();
  QInputMethod::update(uVar2,0x4002);
  return;
}

Assistant:

void QTextEdit::scrollContentsBy(int dx, int dy)
{
    Q_D(QTextEdit);
    if (isRightToLeft())
        dx = -dx;
    d->viewport->scroll(dx, dy);
    QGuiApplication::inputMethod()->update(Qt::ImCursorRectangle | Qt::ImAnchorRectangle);
}